

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

size_t OB::String::damerau_levenshtein
                 (string *lhs,string *rhs,size_t weight_insert,size_t weight_substitute,
                 size_t weight_delete,size_t weight_transpose)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  value_type vVar4;
  value_type vVar5;
  pointer puVar6;
  undefined1 auVar7 [8];
  __type_conflict _Var8;
  const_reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  size_t sVar12;
  ulong uVar13;
  size_t i;
  pointer puVar14;
  pointer *this;
  ulong uVar15;
  long lVar16;
  size_t i_1;
  char *__n;
  value_type vVar17;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  basic_string_view<char,_std::char_traits<char>_> __tmp;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v0;
  undefined1 auStack_88 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  allocator_type local_61;
  pointer local_60;
  undefined1 auStack_58 [8];
  string_view lhsv;
  string_view rhsv;
  
  _Var8 = std::operator==(lhs,rhs);
  if (_Var8) {
    vVar17 = 0;
  }
  else {
    pcVar3 = (lhs->_M_dataplus)._M_p;
    local_60 = (pointer)lhs->_M_string_length;
    rhsv._M_len = (size_t)(rhs->_M_dataplus)._M_p;
    v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)rhs->_M_string_length;
    auStack_58 = (undefined1  [8])local_60;
    lhsv._M_len = (size_t)pcVar3;
    lhsv._M_str = (char *)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < local_60) {
      auStack_58 = (undefined1  [8])
                   v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      lhsv._M_len = rhsv._M_len;
      lhsv._M_str = (char *)local_60;
      rhsv._M_len = (size_t)pcVar3;
    }
    for (puVar14 = (pointer)0x0; puVar14 < (ulong)auStack_58; puVar14 = (pointer)((long)puVar14 + 1)
        ) {
      pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                          (size_type)puVar14);
      cVar1 = *pvVar9;
      pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                         ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                          (size_type)puVar14);
      if (cVar1 != *pvVar9) {
        if (puVar14 != (pointer)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                     (size_type)puVar14,0xffffffffffffffff);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                     (size_type)puVar14,0xffffffffffffffff);
        }
        break;
      }
    }
    lVar16 = -1;
    for (puVar14 = (pointer)0x0; puVar14 < (ulong)auStack_58; puVar14 = (pointer)((long)puVar14 + 1)
        ) {
      pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                          (long)auStack_58 + lVar16);
      cVar1 = *pvVar9;
      pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                         ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                          (size_type)(lhsv._M_str + lVar16));
      if (cVar1 != *pvVar9) {
        if (puVar14 != (pointer)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,0,
                     (long)auStack_58 + ~(ulong)puVar14);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,0,
                     (size_type)(lhsv._M_str + ~(ulong)puVar14));
        }
        break;
      }
      lVar16 = lVar16 + -1;
    }
    auVar7 = auStack_58;
    if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < local_60) {
      auStack_58 = (undefined1  [8])lhsv._M_str;
      lhsv._M_len = rhsv._M_len;
      lhsv._M_str = (char *)auVar7;
    }
    if (auStack_58 == (undefined1  [8])0x0) {
      vVar17 = (long)lhsv._M_str * weight_insert;
    }
    else if (lhsv._M_str == (char *)0x0) {
      vVar17 = (long)auStack_58 * weight_delete;
    }
    else {
      v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                 (size_type)(lhsv._M_str + 1),
                 (value_type_conflict1 *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(allocator_type *)auStack_88);
      auStack_88 = (undefined1  [8])0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)(lhsv._M_str + 1),
                 (value_type_conflict1 *)auStack_88,(allocator_type *)&__tmp._M_str);
      __tmp._M_str = (char *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                 (size_type)(lhsv._M_str + 1),(value_type_conflict1 *)&__tmp._M_str,&local_61);
      vVar17 = 0;
      for (__n = (char *)0x0; __n <= lhsv._M_str; __n = __n + 1) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)__n);
        *pvVar10 = vVar17;
        vVar17 = vVar17 + weight_insert;
      }
      puVar14 = (pointer)0x0;
      while (puVar14 < (ulong)auStack_58) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,0);
        *pvVar10 = (long)((long)puVar14 + 1U) * weight_delete;
        local_60 = (pointer)0x0;
        while (puVar6 = local_60,
              this = &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage, local_60 < lhsv._M_str) {
          local_60 = (pointer)((long)local_60 + 1);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                               (size_type)local_60);
          vVar17 = *pvVar10;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                               (size_type)puVar6);
          vVar4 = *pvVar10;
          v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar6;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                               (size_type)puVar6);
          vVar5 = *pvVar10;
          pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                              (size_type)puVar14);
          cVar1 = *pvVar9;
          pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                             ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                              (size_type)
                              v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          cVar2 = *pvVar9;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88,
                               (size_type)local_60);
          puVar6 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          sVar12 = weight_substitute;
          if (cVar1 == cVar2) {
            sVar12 = 0;
          }
          uVar13 = sVar12 + vVar5;
          if (vVar4 + weight_insert <= sVar12 + vVar5) {
            uVar13 = vVar4 + weight_insert;
          }
          if (vVar17 + weight_delete <= uVar13) {
            uVar13 = vVar17 + weight_delete;
          }
          *pvVar10 = uVar13;
          if (puVar14 != (pointer)0x0 &&
              v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                                (long)puVar14 - 1);
            cVar1 = *pvVar9;
            pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                               ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                                (size_type)puVar6);
            if (cVar1 == *pvVar9) {
              pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                 ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
                                  (size_type)puVar14);
              cVar1 = *pvVar9;
              __pos = (long)puVar6 - 1;
              pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::at
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&lhsv._M_str,
                                  __pos);
              if (cVar1 == *pvVar9) {
                pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_d0,(size_type)local_60);
                pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_d0,__pos);
                vVar17 = *pvVar11;
                uVar13 = *pvVar10;
                pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     auStack_88,(size_type)local_60);
                uVar15 = vVar17 + weight_transpose;
                if (uVar13 <= vVar17 + weight_transpose) {
                  uVar15 = uVar13;
                }
                *pvVar10 = uVar15;
              }
            }
          }
        }
        puVar6 = (pointer)local_d0;
        local_d0 = (undefined1  [8])
                   v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)auStack_88;
        puVar14 = (pointer)((long)puVar14 + 1U);
        auStack_88 = (undefined1  [8])puVar6;
      }
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)lhsv._M_str
                          );
      vVar17 = *pvVar10;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_88);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    }
  }
  return vVar17;
}

Assistant:

std::size_t damerau_levenshtein(std::string const& lhs, std::string const& rhs,
  std::size_t const weight_insert, std::size_t const weight_substitute,
  std::size_t const weight_delete, std::size_t const weight_transpose)
{
  if (lhs == rhs)
  {
    return 0;
  }

  std::string_view lhsv {lhs};
  std::string_view rhsv {rhs};

  bool swapped {false};
  if (lhsv.size() > rhsv.size())
  {
    swapped = true;
    std::swap(lhsv, rhsv);
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(i) != rhsv.at(i))
    {
      if (i)
      {
        lhsv.substr(i);
        rhsv.substr(i);
      }

      break;
    }
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(lhsv.size() - 1 - i) != rhsv.at(rhsv.size() - 1 - i))
    {
      if (i)
      {
        lhsv.substr(0, lhsv.size() - 1 - i);
        rhsv.substr(0, rhsv.size() - 1 - i);
      }

      break;
    }
  }

  if (swapped)
  {
    std::swap(lhsv, rhsv);
  }

  if (lhsv.empty())
  {
    return rhsv.size() * weight_insert;
  }

  if (rhsv.empty())
  {
    return lhsv.size() * weight_delete;
  }

  std::vector<std::size_t> v0 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v1 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v2 (rhsv.size() + 1, 0);

  for (std::size_t i = 0; i <= rhsv.size(); ++i)
  {
    v1.at(i) = i * weight_insert;
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    v2.at(0) = (i + 1) * weight_delete;
    for (std::size_t j = 0; j < rhsv.size(); j++)
    {
      v2.at(j + 1) = std::min(
        // deletion
        v1.at(j + 1) + weight_delete,
        std::min(
          // insertion
          v2.at(j) + weight_insert,
          // substitution
          v1.at(j) + (weight_substitute * (lhsv.at(i) != rhsv.at(j)))));

      if (i > 0 && j > 0 &&
        (lhsv.at(i - 1) == rhsv.at(j)) &&
        (lhsv.at(i) == rhsv.at(j - 1)))
      {
        v2.at(j + 1) = std::min(
          v0.at(j + 1),
          // transposition
          v0.at(j - 1) + weight_transpose);
      }
    }

    std::swap(v0, v1);
    std::swap(v1, v2);
  }

  return v1.at(rhsv.size());
}